

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O3

void __thiscall
TPZFrontSym<std::complex<double>_>::Compress(TPZFrontSym<std::complex<double>_> *this)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  complex<double> *pcVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int64_t iVar17;
  long lVar18;
  TPZStack<long,_10> from;
  TPZManVector<long,_10> TStack_98;
  
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&TStack_98);
  lVar9 = (this->super_TPZFront<std::complex<double>_>).fFront;
  if (0 < lVar9) {
    lVar18 = 0;
    do {
      if ((this->super_TPZFront<std::complex<double>_>).fGlobal.super_TPZVec<long>.fStore[lVar18] !=
          -1) {
        TPZStack<long,_10>::Push((TPZStack<long,_10> *)&TStack_98,lVar18);
        lVar9 = (this->super_TPZFront<std::complex<double>_>).fFront;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < lVar9);
  }
  if (TStack_98.super_TPZVec<long>.fNElements < 1) {
    lVar9 = 0;
  }
  else {
    plVar4 = (this->super_TPZFront<std::complex<double>_>).fGlobal.super_TPZVec<long>.fStore;
    plVar5 = (this->super_TPZFront<std::complex<double>_>).fLocal.fStore;
    lVar18 = 0;
    do {
      lVar9 = plVar4[TStack_98.super_TPZVec<long>.fStore[lVar18]];
      plVar4[lVar18] = lVar9;
      plVar5[lVar9] = lVar18;
      lVar18 = lVar18 + 1;
      lVar9 = TStack_98.super_TPZVec<long>.fNElements;
    } while (TStack_98.super_TPZVec<long>.fNElements != lVar18);
  }
  if (lVar9 < (this->super_TPZFront<std::complex<double>_>).fGlobal.super_TPZVec<long>.fNElements) {
    plVar4 = (this->super_TPZFront<std::complex<double>_>).fGlobal.super_TPZVec<long>.fStore;
    lVar18 = lVar9;
    do {
      plVar4[lVar18] = -1;
      lVar18 = lVar18 + 1;
    } while (lVar18 < (this->super_TPZFront<std::complex<double>_>).fGlobal.super_TPZVec<long>.
                      fNElements);
  }
  iVar17 = (this->super_TPZFront<std::complex<double>_>).fFree.super_TPZManVector<int,_10>.
           super_TPZVec<int>.fNElements + TStack_98.super_TPZVec<long>.fNElements;
  if (iVar17 != (this->super_TPZFront<std::complex<double>_>).fFront) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZFront.Compress inconsistent data structure\n",0x2e);
    iVar17 = (this->super_TPZFront<std::complex<double>_>).fFront;
  }
  (this->super_TPZFront<std::complex<double>_>).fFront = TStack_98.super_TPZVec<long>.fNElements;
  TPZManVector<int,_10>::Resize
            (&(this->super_TPZFront<std::complex<double>_>).fFree.super_TPZManVector<int,_10>,0);
  TPZManVector<long,_10>::Resize
            (&(this->super_TPZFront<std::complex<double>_>).fGlobal,
             (this->super_TPZFront<std::complex<double>_>).fFront);
  if ((this->super_TPZFront<std::complex<double>_>).fData.fNElements != 0) {
    if (TStack_98.super_TPZVec<long>.fNElements < 1) {
      TStack_98.super_TPZVec<long>.fNElements = 0;
    }
    else {
      lVar10 = 1;
      lVar11 = 2;
      lVar12 = 0;
      lVar18 = 0;
      do {
        lVar13 = lVar12 * 8;
        lVar1 = lVar18 + 1;
        lVar14 = 0;
        do {
          lVar6 = TStack_98.super_TPZVec<long>.fStore[lVar14];
          lVar15 = TStack_98.super_TPZVec<long>.fStore[lVar18];
          lVar16 = lVar15;
          if (lVar15 < lVar6) {
            lVar16 = lVar6;
          }
          if (lVar6 < lVar15) {
            lVar15 = lVar6;
          }
          lVar16 = (lVar16 + 1) * lVar16;
          pcVar7 = (this->super_TPZFront<std::complex<double>_>).fData.fStore;
          puVar2 = (undefined8 *)
                   (pcVar7[lVar15]._M_value + (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) * 8)
          ;
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)(pcVar7->_M_value + lVar13);
          *puVar3 = *puVar2;
          puVar3[1] = uVar8;
          lVar14 = lVar14 + 1;
          lVar13 = lVar13 + 0x10;
        } while (lVar10 != lVar14);
        lVar10 = lVar10 + 1;
        lVar12 = lVar12 + lVar11;
        lVar11 = lVar11 + 2;
        lVar18 = lVar1;
      } while (lVar1 != TStack_98.super_TPZVec<long>.fNElements);
    }
    if (TStack_98.super_TPZVec<long>.fNElements < (int)iVar17) {
      do {
        lVar18 = lVar9 + 1;
        lVar10 = 0;
        do {
          lVar11 = lVar9;
          if (lVar9 < lVar10) {
            lVar11 = lVar10;
          }
          lVar12 = lVar9;
          if (lVar10 < lVar9) {
            lVar12 = lVar10;
          }
          lVar10 = lVar10 + 1;
          puVar2 = (undefined8 *)
                   ((this->super_TPZFront<std::complex<double>_>).fData.fStore[lVar12]._M_value +
                   ((lVar11 + 1) * lVar11 & 0xfffffffffffffffeU) * 8);
          *puVar2 = 0;
          puVar2[1] = 0;
        } while (lVar18 != lVar10);
        lVar9 = lVar18;
      } while (lVar18 != (int)iVar17);
    }
  }
  TPZManVector<long,_10>::~TPZManVector(&TStack_98);
  return;
}

Assistant:

void TPZFrontSym<TVar>::Compress(){
	//	PrintGlobal("Before COmpress",output);
	//	Print("Before Compress", cout);
	TPZStack <int64_t> from;
	int64_t nfound;
	int64_t i, j;
	for(i = 0; i < this->fFront; i++){
		if(this->fGlobal[i] != -1) from.Push(i);
	}
	
	/**
	 *First this->fLocal initialization
	 *Any needed updates is done on next loop
	 */
	nfound = from.NElements();
	for(i=0;i<nfound;i++) {
		this->fGlobal[i]=this->fGlobal[from[i]];
		//fGlobal[from[i]] = -1;
		this->fLocal[this->fGlobal[i]] = i;
	}
	for(;i<this->fGlobal.NElements();i++) this->fGlobal[i] = -1;
	
	if(nfound+this->fFree.NElements()!=this->fFront) cout << "TPZFront.Compress inconsistent data structure\n";
	int frontold = this->fFront;
	this->fFront = nfound;
	this->fFree.Resize(0);	
	this->fGlobal.Resize(this->fFront);
	if(this->fData.NElements()==0) return;
	
	for(j = 0; j < nfound; j++){
		for(i = 0; i <= j; i++){
			Element(i,j) = Element(from[i], from[j]);
		}
		//		fGlobal[i] = fGlobal[from[i]];
		//		this->fLocal[fGlobal[i]] = i;
	}
	for(;j<frontold;j++) {
		for(i=0;i<= j; i++) Element(i,j) = 0.;
	}
	
	//	Print("After Compress", cout);
	//	PrintGlobal("After Compress",output);
}